

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O2

void __thiscall
datarate_test::(anonymous_namespace)::DatarateTestSVC_BasicRateTargetingSVC3TL1SLResize_Test::
~DatarateTestSVC_BasicRateTargetingSVC3TL1SLResize_Test
          (DatarateTestSVC_BasicRateTargetingSVC3TL1SLResize_Test *this)

{
  anon_unknown_0::DatarateTestSVC_BasicRateTargetingSVC3TL1SLResize_Test::
  ~DatarateTestSVC_BasicRateTargetingSVC3TL1SLResize_Test
            ((DatarateTestSVC_BasicRateTargetingSVC3TL1SLResize_Test *)(this + -0x18));
  return;
}

Assistant:

TEST_P(DatarateTestSVC, BasicRateTargetingSVC3TL1SLResize) {
  BasicRateTargetingSVC3TL1SLResizeTest();
}